

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * push_data(string *e)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (pbVar2->_M_dataplus)._M_p = (pointer)&pbVar2->field_2;
  pcVar1 = (e->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)pbVar2,pcVar1,pcVar1 + e->_M_string_length);
  if (v_str_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      v_str_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_18 = pbVar2;
    std::vector<std::__cxx11::string*,std::allocator<std::__cxx11::string*>>::
    _M_realloc_insert<std::__cxx11::string*>
              ((vector<std::__cxx11::string*,std::allocator<std::__cxx11::string*>> *)
               &v_str_abi_cxx11_,
               (iterator)
               v_str_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_18);
  }
  else {
    *v_str_abi_cxx11_.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
    v_str_abi_cxx11_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         v_str_abi_cxx11_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  return v_str_abi_cxx11_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1];
}

Assistant:

std::string* push_data(const std::string& e)
{
	v_str.push_back(new std::string(e));
	return v_str[v_str.size() - 1];
}